

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O1

void udbg_writeIcuInfo(FILE *out)

{
  char *pcVar1;
  undefined *puVar2;
  char *__format;
  int32_t i;
  ulong uVar3;
  undefined **ppuVar4;
  UErrorCode status2;
  char str [2000];
  UErrorCode local_80c;
  char local_808 [2008];
  
  fwrite(" <icuSystemParams type=\"icu4c\">\n",0x20,1,(FILE *)out);
  ppuVar4 = &systemParams;
  uVar3 = 0;
  while( true ) {
    if (uVar3 < 0x15) {
      puVar2 = *ppuVar4;
    }
    else {
      puVar2 = (undefined *)0x0;
    }
    if (puVar2 == (undefined *)0x0) break;
    local_80c = U_ZERO_ERROR;
    if (uVar3 < 0x15) {
      (*(code *)ppuVar4[1])(ppuVar4,local_808,2000,&local_80c);
    }
    if (local_80c < U_ILLEGAL_ARGUMENT_ERROR) {
      __format = "    <param name=\"%s\">%s</param>\n";
      pcVar1 = local_808;
    }
    else {
      pcVar1 = u_errorName_63(local_80c);
      __format = "  <!-- n=\"%s\" ERROR: %s -->\n";
    }
    fprintf((FILE *)out,__format,puVar2,pcVar1);
    uVar3 = uVar3 + 1;
    ppuVar4 = ppuVar4 + 4;
  }
  fwrite(" </icuSystemParams>\n",0x14,1,(FILE *)out);
  return;
}

Assistant:

U_CAPI void udbg_writeIcuInfo(FILE *out) {
  char str[2000];
  /* todo: API for writing DTD? */
  fprintf(out, " <icuSystemParams type=\"icu4c\">\n");
  const char *paramName;
  for(int32_t i=0;(paramName=udbg_getSystemParameterNameByIndex(i))!=NULL;i++) {
    UErrorCode status2 = U_ZERO_ERROR;
    udbg_getSystemParameterValueByIndex(i, str,2000,&status2);
    if(U_SUCCESS(status2)) {
      fprintf(out,"    <param name=\"%s\">%s</param>\n", paramName,str);
    } else {
      fprintf(out,"  <!-- n=\"%s\" ERROR: %s -->\n", paramName, u_errorName(status2));
    }
  }
  fprintf(out, " </icuSystemParams>\n");
}